

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

void __thiscall ClipperLib::Clipper::ProcessHorizontals(Clipper *this)

{
  TEdge *local_18;
  TEdge *horzEdge;
  Clipper *this_local;
  
  local_18 = this->m_SortedEdges;
  while (local_18 != (TEdge *)0x0) {
    DeleteFromSEL(this,local_18);
    ProcessHorizontal(this,local_18);
    local_18 = this->m_SortedEdges;
  }
  return;
}

Assistant:

void Clipper::ProcessHorizontals()
{
  TEdge* horzEdge = m_SortedEdges;
  while( horzEdge )
  {
    DeleteFromSEL( horzEdge );
    ProcessHorizontal( horzEdge );
    horzEdge = m_SortedEdges;
  }
}